

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_cherryhills.c
# Opt level: O0

mraa_board_t * mraa_intel_cherryhills(void)

{
  mraa_board_t *__ptr;
  mraa_pininfo_t *pmVar1;
  mraa_adv_func_t *pmVar2;
  mraa_pincapabilities_t local_30;
  mraa_pincapabilities_t local_2c;
  mraa_pincapabilities_t local_28;
  mraa_pincapabilities_t local_24;
  mraa_pincapabilities_t local_20;
  int pos;
  mraa_board_t *b;
  
  __ptr = (mraa_board_t *)calloc(1,0x5f0);
  if (__ptr != (mraa_board_t *)0x0) {
    __ptr->platform_name = "Braswell Cherry Hill";
    __ptr->phy_pin_count = 6;
    __ptr->aio_count = 0;
    __ptr->adc_raw = 0;
    __ptr->adc_supported = 0;
    pmVar1 = (mraa_pininfo_t *)malloc(0x11b8);
    __ptr->pins = pmVar1;
    if (__ptr->pins != (mraa_pininfo_t *)0x0) {
      pmVar2 = (mraa_adv_func_t *)calloc(1,0x288);
      __ptr->adv_func = pmVar2;
      if (__ptr->adv_func != (mraa_adv_func_t *)0x0) {
        strncpy(__ptr->pins->name,"GSUS6",8);
        local_20._0_1_ = 3;
        __ptr->pins->capabilities = local_20;
        (__ptr->pins->gpio).pinmap = 0x1a0;
        (__ptr->pins->gpio).mux_total = 0;
        strncpy(__ptr->pins[1].name,"GSUS8",8);
        local_24._0_1_ = 3;
        __ptr->pins[1].capabilities = local_24;
        __ptr->pins[1].gpio.pinmap = 0x199;
        __ptr->pins[1].gpio.mux_total = 0;
        strncpy(__ptr->pins[2].name,"GSUS7",8);
        local_28._0_1_ = 3;
        __ptr->pins[2].capabilities = local_28;
        __ptr->pins[2].gpio.pinmap = 0x19e;
        __ptr->pins[2].gpio.mux_total = 0;
        strncpy(__ptr->pins[3].name,"GSUS0",8);
        local_2c._0_1_ = 3;
        __ptr->pins[3].capabilities = local_2c;
        __ptr->pins[3].gpio.pinmap = 0x196;
        __ptr->pins[3].gpio.mux_total = 0;
        strncpy(__ptr->pins[4].name,"GSUS1",8);
        local_30._0_1_ = 3;
        __ptr->pins[4].capabilities = local_30;
        __ptr->pins[4].gpio.pinmap = 0x19a;
        __ptr->pins[4].gpio.mux_total = 0;
        return __ptr;
      }
      free(__ptr->pins);
    }
    syslog(2,"Cherryhills(Braswell): Platform failed to initialise");
    free(__ptr);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_cherryhills()
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    b->phy_pin_count = MRAA_INTEL_CHERRYHILLS_PINCOUNT;
    b->aio_count = 0;
    b->adc_raw = 0;
    b->adc_supported = 0;

    b->pins = (mraa_pininfo_t*) malloc(sizeof(mraa_pininfo_t) * MRAA_INTEL_CHERRYHILLS_PINCOUNT);
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    int pos = 0;
    //Physical header where these pins are: J3E5
    strncpy(b->pins[pos].name, "GSUS6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 416;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "GSUS8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 409;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "GSUS7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 414;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    //Physical header where these pins are: J3E3
    strncpy(b->pins[pos].name, "GSUS0", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 406;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "GSUS1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 410;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    return b;
error:
    syslog(LOG_CRIT, "Cherryhills(Braswell): Platform failed to initialise");
    free(b);
    return NULL;
}